

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  uint uVar2;
  OfType OVar3;
  element_type *peVar4;
  XmlWriter *this_00;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  MessageInfo *msg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  bool includeResults;
  AssertionResult *result;
  AssertionResult *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  XmlFormatting in_stack_fffffffffffffb74;
  undefined7 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7f;
  XmlWriter *in_stack_fffffffffffffb80;
  XmlFormatting XVar5;
  XmlWriter *in_stack_fffffffffffffb88;
  AssertionResult *in_stack_fffffffffffffb90;
  XmlFormatting XVar6;
  AssertionResult *in_stack_fffffffffffffb98;
  string *text;
  XmlWriter *in_stack_fffffffffffffba0;
  XmlReporter *in_stack_fffffffffffffba8;
  XmlReporter *this_01;
  StringRef *in_stack_fffffffffffffbb8;
  allocator *paVar7;
  string *in_stack_fffffffffffffbc0;
  XmlWriter *in_stack_fffffffffffffbc8;
  byte local_351;
  undefined1 local_33a [18];
  SourceLineInfo local_328;
  allocator local_311;
  SourceLineInfo local_310;
  allocator local_2fa;
  allocator local_2f9 [24];
  allocator local_2e1 [17];
  SourceLineInfo local_2d0;
  StringRef local_2c0;
  allocator local_2ac;
  allocator local_2ab;
  allocator local_2aa;
  allocator local_2a9 [40];
  allocator local_281 [17];
  reference local_270;
  MessageInfo *local_268;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_260;
  long local_258;
  byte local_249;
  AssertionResult *local_248;
  long local_240;
  char local_229;
  string local_228;
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_248 = (AssertionResult *)(in_RSI + 8);
  local_240 = in_RSI;
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x255c45);
  uVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[5])();
  local_351 = 1;
  if ((uVar2 & 1) == 0) {
    bVar1 = AssertionResult::isOk
                      ((AssertionResult *)
                       CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    local_351 = bVar1 ^ 0xff;
  }
  local_249 = local_351 & 1;
  if ((local_249 != 0) || (OVar3 = AssertionResult::getResultType(local_248), OVar3 == Warning)) {
    local_258 = local_240 + 0x98;
    local_260._M_current =
         (MessageInfo *)
         clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                   ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                    in_stack_fffffffffffffb68);
    local_268 = (MessageInfo *)
                clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                          ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                           in_stack_fffffffffffffb68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                              (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)in_stack_fffffffffffffb68), bVar1) {
      local_270 = __gnu_cxx::
                  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                  ::operator*(&local_260);
      if ((local_270->type == Info) && ((local_249 & 1) != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_28,"Info",local_281);
        operator|(Newline,Indent);
        XmlWriter::scopedElement
                  ((XmlWriter *)in_stack_fffffffffffffb98,(string *)in_stack_fffffffffffffb90,
                   (XmlFormatting)((ulong)in_stack_fffffffffffffb88 >> 0x20));
        operator|(Newline,Indent);
        XmlWriter::ScopedElement::writeText
                  ((ScopedElement *)in_stack_fffffffffffffb80,
                   (string *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                   in_stack_fffffffffffffb74);
        XmlWriter::ScopedElement::~ScopedElement
                  ((ScopedElement *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        std::__cxx11::string::~string(local_28);
        std::allocator<char>::~allocator((allocator<char> *)local_281);
      }
      else if (local_270->type == Warning) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_48,"Warning",local_2a9);
        operator|(Newline,Indent);
        XmlWriter::scopedElement
                  ((XmlWriter *)in_stack_fffffffffffffb98,(string *)in_stack_fffffffffffffb90,
                   (XmlFormatting)((ulong)in_stack_fffffffffffffb88 >> 0x20));
        operator|(Newline,Indent);
        XmlWriter::ScopedElement::writeText
                  ((ScopedElement *)in_stack_fffffffffffffb80,
                   (string *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                   in_stack_fffffffffffffb74);
        XmlWriter::ScopedElement::~ScopedElement
                  ((ScopedElement *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        std::__cxx11::string::~string(local_48);
        std::allocator<char>::~allocator((allocator<char> *)local_2a9);
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
      ::operator++(&local_260);
    }
  }
  if (((local_249 & 1) != 0) ||
     (OVar3 = AssertionResult::getResultType(local_248), OVar3 == Warning)) {
    bVar1 = AssertionResult::hasExpression((AssertionResult *)0x25602e);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"Expression",&local_2aa);
      operator|(Newline,Indent);
      XmlWriter::startElement
                (in_stack_fffffffffffffb80,
                 (string *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                 in_stack_fffffffffffffb74);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"success",&local_2ab);
      AssertionResult::succeeded((AssertionResult *)0x2560f0);
      XmlWriter::writeAttribute
                (in_stack_fffffffffffffb80,
                 (string *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                 SUB41(in_stack_fffffffffffffb74 >> 0x18,0));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"type",&local_2ac);
      local_2c0 = AssertionResult::getTestMacroName(local_248);
      XmlWriter::writeAttribute<Catch::StringRef>
                (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2ac);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_2ab);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_2aa);
      local_2d0 = AssertionResult::getSourceInfo(local_248);
      writeSourceInfo(in_stack_fffffffffffffba8,(SourceLineInfo *)in_stack_fffffffffffffba0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"Original",local_2e1);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                ((XmlWriter *)in_stack_fffffffffffffb98,(string *)in_stack_fffffffffffffb90,
                 (XmlFormatting)((ulong)in_stack_fffffffffffffb88 >> 0x20));
      AssertionResult::getExpression_abi_cxx11_(in_stack_fffffffffffffb98);
      operator|(Newline,Indent);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffb80,
                 (string *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                 in_stack_fffffffffffffb74);
      std::__cxx11::string::~string(local_e8);
      XmlWriter::ScopedElement::~ScopedElement
                ((ScopedElement *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)local_2e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"Expanded",local_2f9);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                ((XmlWriter *)in_stack_fffffffffffffb98,(string *)in_stack_fffffffffffffb90,
                 (XmlFormatting)((ulong)in_stack_fffffffffffffb88 >> 0x20));
      AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_fffffffffffffb90);
      operator|(Newline,Indent);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffb80,
                 (string *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                 in_stack_fffffffffffffb74);
      std::__cxx11::string::~string(local_128);
      XmlWriter::ScopedElement::~ScopedElement
                ((ScopedElement *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)local_2f9);
    }
    OVar3 = AssertionResult::getResultType(local_248);
    if (OVar3 == Info) {
      paVar7 = (allocator *)(local_33a + 1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c8,"Info",paVar7);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                ((XmlWriter *)in_stack_fffffffffffffb98,(string *)in_stack_fffffffffffffb90,
                 (XmlFormatting)((ulong)in_stack_fffffffffffffb88 >> 0x20));
      AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffb68);
      operator|(Newline,Indent);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffb80,
                 (string *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                 in_stack_fffffffffffffb74);
      std::__cxx11::string::~string(local_1e8);
      XmlWriter::ScopedElement::~ScopedElement
                ((ScopedElement *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)(local_33a + 1));
    }
    else if (OVar3 != Warning) {
      if (OVar3 == ExplicitFailure) {
        this_00 = (XmlWriter *)(in_RDI + 0x170);
        this_01 = (XmlReporter *)local_33a;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_208,"Failure",(allocator *)this_01);
        operator|(Newline,Indent);
        XmlWriter::startElement
                  (in_stack_fffffffffffffb80,
                   (string *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                   in_stack_fffffffffffffb74);
        XVar6 = (XmlFormatting)((ulong)in_stack_fffffffffffffb80 >> 0x20);
        std::__cxx11::string::~string(local_208);
        std::allocator<char>::~allocator((allocator<char> *)local_33a);
        AssertionResult::getSourceInfo(local_248);
        writeSourceInfo(this_01,(SourceLineInfo *)this_00);
        XVar5 = (XmlFormatting)((ulong)(in_RDI + 0x170) >> 0x20);
        text = &local_228;
        AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffb68);
        operator|(Newline,Indent);
        XmlWriter::writeText(this_00,text,XVar5);
        std::__cxx11::string::~string((string *)&local_228);
        in_stack_fffffffffffffb88 = (XmlWriter *)(in_RDI + 0x170);
        operator|(Newline,Indent);
        XmlWriter::endElement(in_stack_fffffffffffffb88,XVar6);
      }
      else if (OVar3 == ThrewException) {
        std::allocator<char>::allocator();
        XVar6 = (XmlFormatting)((ulong)in_stack_fffffffffffffb90 >> 0x20);
        std::__cxx11::string::string(local_148,"Exception",&local_2fa);
        operator|(Newline,Indent);
        XmlWriter::startElement
                  (in_stack_fffffffffffffb80,
                   (string *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                   in_stack_fffffffffffffb74);
        XVar5 = (XmlFormatting)((ulong)in_stack_fffffffffffffb80 >> 0x20);
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_2fa);
        local_310 = AssertionResult::getSourceInfo(local_248);
        writeSourceInfo(in_stack_fffffffffffffba8,(SourceLineInfo *)in_stack_fffffffffffffba0);
        AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffb68);
        operator|(Newline,Indent);
        XmlWriter::writeText(in_stack_fffffffffffffba0,(string *)in_stack_fffffffffffffb98,XVar6);
        std::__cxx11::string::~string(local_168);
        operator|(Newline,Indent);
        XmlWriter::endElement(in_stack_fffffffffffffb88,XVar5);
      }
      else if (OVar3 == FatalErrorCondition) {
        std::allocator<char>::allocator();
        XVar6 = (XmlFormatting)((ulong)in_stack_fffffffffffffb90 >> 0x20);
        std::__cxx11::string::string(local_188,"FatalErrorCondition",&local_311);
        operator|(Newline,Indent);
        XmlWriter::startElement
                  (in_stack_fffffffffffffb80,
                   (string *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                   in_stack_fffffffffffffb74);
        XVar5 = (XmlFormatting)((ulong)in_stack_fffffffffffffb80 >> 0x20);
        std::__cxx11::string::~string(local_188);
        std::allocator<char>::~allocator((allocator<char> *)&local_311);
        local_328 = AssertionResult::getSourceInfo(local_248);
        writeSourceInfo(in_stack_fffffffffffffba8,(SourceLineInfo *)in_stack_fffffffffffffba0);
        AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffb68);
        operator|(Newline,Indent);
        XmlWriter::writeText(in_stack_fffffffffffffba0,(string *)in_stack_fffffffffffffb98,XVar6);
        std::__cxx11::string::~string(local_1a8);
        operator|(Newline,Indent);
        XmlWriter::endElement(in_stack_fffffffffffffb88,XVar5);
      }
    }
    bVar1 = AssertionResult::hasExpression((AssertionResult *)0x256d03);
    if (bVar1) {
      XVar5 = (XmlFormatting)((ulong)(in_RDI + 0x170) >> 0x20);
      operator|(Newline,Indent);
      XmlWriter::endElement(in_stack_fffffffffffffb88,XVar5);
    }
  }
  local_229 = '\x01';
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }